

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

bool __thiscall
wasm::ValidationInfo::shouldBeEqual<wasm::ArrayCopy*,wasm::Field::PackedType>
          (ValidationInfo *this,PackedType left,PackedType right,ArrayCopy *curr,char *text,
          Function *func)

{
  ostream *poVar1;
  size_t sVar2;
  ostringstream local_1d8 [8];
  ostringstream ss;
  ios_base local_168 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Function *local_40;
  ArrayCopy *local_38;
  
  if (left != right) {
    local_40 = func;
    local_38 = curr;
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar1 = (ostream *)std::ostream::operator<<(local_1d8,left);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," != ",4);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,right);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
    if (text == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar2 = strlen(text);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,text,sVar2);
    }
    std::__cxx11::stringbuf::str();
    fail<wasm::ArrayCopy*,std::__cxx11::string>(this,&local_60,local_38,local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
    std::ios_base::~ios_base(local_168);
  }
  return left == right;
}

Assistant:

bool shouldBeEqual(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left != right) {
      std::ostringstream ss;
      ss << left << " != " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }